

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O3

int Fra_Clau(Aig_Man_t *pMan,int nIters,int fVerbose,int fVeryVerbose)

{
  sat_solver *s;
  lit *begin;
  int iVar1;
  int iVar2;
  Cla_Man_t *p;
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  Vec_Int_t *pVVar10;
  
  if (pMan->nObjs[3] - pMan->nRegs != 1) {
    __assert_fail("Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                  ,0x281,"int Fra_Clau(Aig_Man_t *, int, int, int)");
  }
  p = Fra_ClauStart(pMan);
  if (p == (Cla_Man_t *)0x0) {
    puts("The property is trivially inductive.");
  }
  else {
    pVVar8 = p->vCexMain0;
    iVar1 = Fra_ClauCheckProperty(p,pVVar8);
    uVar9 = 0;
    if (0 < nIters && iVar1 == 0) {
      bVar3 = fVeryVerbose != 0 && fVerbose != 0;
      uVar6 = 0;
      do {
        iVar1 = (int)uVar6;
        if (fVerbose == 0) {
          pVVar10 = p->vCexMain;
          Fra_ClauRemapClause(p->pMapCsMainToCsTest,pVVar8,pVVar10,0);
        }
        else {
          printf("%4d : ",uVar6);
          pVVar10 = p->vCexMain;
          Fra_ClauRemapClause(p->pMapCsMainToCsTest,pVVar8,pVVar10,0);
          if (bVar3) {
            Fra_ClauPrintClause(p->vSatVarsTestCs,pVVar10);
          }
        }
        iVar2 = Fra_ClauCheckClause(p,pVVar10,p->vCexTest);
        uVar9 = 0;
        if (iVar2 == 0) {
          uVar9 = 0;
LAB_005fa9ba:
          pVVar8 = p->vCexMain;
          pVVar10 = p->vCexTest;
          Fra_ClauReduceClause(pVVar8,pVVar10);
          Fra_ClauRemapClause(p->pMapCsTestToNsBmc,pVVar8,p->vCexBmc,0);
          if (0 < pVVar8->nSize) goto code_r0x005fa9ee;
          pVVar8 = p->vCexMain0;
          lVar4 = (long)pVVar8->nSize;
          begin = pVVar8->pArray;
          if (0 < lVar4) {
            lVar5 = 0;
            do {
              *(byte *)(begin + lVar5) = *(byte *)(begin + lVar5) ^ 1;
              lVar5 = lVar5 + 1;
              lVar4 = (long)pVVar8->nSize;
            } while (lVar5 < lVar4);
          }
          iVar2 = sat_solver_addclause(p->pSatMain,begin,begin + lVar4);
          if (iVar2 == 0) {
            pcVar7 = "\nProperty is proved after %d iterations.\n";
            uVar6 = (ulong)(iVar1 + 1);
            goto LAB_005fabc1;
          }
          if (fVerbose != 0) {
            pcVar7 = " Reducing failed after %d iterations (BMC failed).\n";
            goto LAB_005fab6f;
          }
          goto LAB_005fab79;
        }
LAB_005faa03:
        pVVar8 = p->vCexMain;
        if (pVVar8->nSize != 0) {
          if (fVerbose != 0) {
            printf("  ");
            if (bVar3) {
              Fra_ClauPrintClause(p->vSatVarsTestCs,pVVar8);
            }
            printf(" LitsInd = %3d.  ",(ulong)(uint)pVVar8->nSize);
          }
          pVVar10 = p->vCexBase;
          pVVar10->nSize = 0;
          uVar9 = pVVar8->nSize;
          if (1 < (int)uVar9) {
            Fra_ClauMinimizeClause(p,pVVar10,pVVar8);
            pVVar8 = p->vCexMain;
            uVar9 = pVVar8->nSize;
          }
          if ((int)uVar9 < 1) {
            __assert_fail("Vec_IntSize(p->vCexMain) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                          ,0x2c0,"int Fra_Clau(Aig_Man_t *, int, int, int)");
          }
          if (fVeryVerbose != 0 && fVerbose != 0) {
            Fra_ClauPrintClause(p->vSatVarsTestCs,pVVar8);
            uVar9 = pVVar8->nSize;
LAB_005faab1:
            printf(" LitsRed = %3d.  ",(ulong)uVar9);
            putchar(10);
          }
          else if (fVerbose != 0) goto LAB_005faab1;
          pVVar10 = p->vCexAssm;
          Fra_ClauRemapClause(p->pMapCsTestToCsMain,pVVar8,pVVar10,1);
          s = p->pSatMain;
          iVar2 = sat_solver_addclause(s,pVVar10->pArray,pVVar10->pArray + pVVar10->nSize);
          if (iVar2 != 0) {
            if (s->qtail != s->qhead) {
              iVar2 = sat_solver_simplify(s);
              if (iVar2 == 0) {
                __assert_fail("RetValue != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                              ,0x2d2,"int Fra_Clau(Aig_Man_t *, int, int, int)");
              }
              if (s->qtail != s->qhead) {
                __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                              ,0x2d3,"int Fra_Clau(Aig_Man_t *, int, int, int)");
              }
            }
            goto LAB_005fab79;
          }
LAB_005fabaf:
          uVar9 = iVar1 + 1;
          break;
        }
        if (fVerbose != 0) {
          pcVar7 = " Reducing failed after %d iterations (nothing left).\n";
LAB_005fab6f:
          printf(pcVar7,(ulong)uVar9);
        }
LAB_005fab79:
        uVar9 = iVar1 + 1;
        uVar6 = (ulong)uVar9;
        pVVar8 = p->vCexMain0;
        iVar2 = Fra_ClauCheckProperty(p,pVVar8);
        if (iVar2 != 0) goto LAB_005fabaf;
      } while ((int)uVar9 < nIters);
    }
    uVar6 = (ulong)(uint)nIters;
    if (uVar9 == nIters) {
      pcVar7 = "Property is not proved after %d iterations.\n";
LAB_005fabc1:
      printf(pcVar7,uVar6);
      return 0;
    }
    printf("Property is proved after %d iterations.\n",(ulong)uVar9);
    Fra_ClauStop(p);
  }
  return 1;
code_r0x005fa9ee:
  uVar9 = uVar9 + 1;
  iVar2 = Fra_ClauCheckClause(p,pVVar8,pVVar10);
  if (iVar2 != 0) goto LAB_005faa03;
  goto LAB_005fa9ba;
}

Assistant:

int Fra_Clau( Aig_Man_t * pMan, int nIters, int fVerbose, int fVeryVerbose )
{
    Cla_Man_t * p;
    int Iter, RetValue, fFailed, i;
    assert( Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) == 1 );
    // create the manager
    p = Fra_ClauStart( pMan );
    if ( p == NULL )
    {
        printf( "The property is trivially inductive.\n" );
        return 1;
    }
    // generate counter-examples and expand them
    for ( Iter = 0; !Fra_ClauCheckProperty( p, p->vCexMain0 ) && Iter < nIters; Iter++ )
    {
        if ( fVerbose )
            printf( "%4d : ", Iter );
        // remap clause into the test manager
        Fra_ClauRemapClause( p->pMapCsMainToCsTest, p->vCexMain0, p->vCexMain, 0 );
        if ( fVerbose && fVeryVerbose )
            Fra_ClauPrintClause( p->vSatVarsTestCs, p->vCexMain );
        // the main counter-example is in p->vCexMain
        // intermediate counter-examples are in p->vCexTest
        // generate the reduced counter-example to the inductive property
        fFailed = 0;
        for ( i = 0; !Fra_ClauCheckClause( p, p->vCexMain, p->vCexTest ); i++ )
        {
            Fra_ClauReduceClause( p->vCexMain, p->vCexTest );
            Fra_ClauRemapClause( p->pMapCsTestToNsBmc, p->vCexMain, p->vCexBmc, 0 );

//            if ( !Fra_ClauCheckBmc(p, p->vCexBmc) )
            if ( Vec_IntSize(p->vCexMain) < 1 )
            {
                Vec_IntComplement( p->vCexMain0 ); 
                RetValue = sat_solver_addclause( p->pSatMain, Vec_IntArray(p->vCexMain0), Vec_IntArray(p->vCexMain0) + Vec_IntSize(p->vCexMain0) );
                if ( RetValue == 0 )
                {
                    printf( "\nProperty is proved after %d iterations.\n", Iter+1 );
                    return 0;
                }
                fFailed = 1;
                break;
            }
        }
        if ( fFailed )
        {
            if ( fVerbose )
                printf( " Reducing failed after %d iterations (BMC failed).\n", i );
            continue;
        }
        if ( Vec_IntSize(p->vCexMain) == 0 )
        {
            if ( fVerbose )
                printf( " Reducing failed after %d iterations (nothing left).\n", i );
            continue;
        }
        if ( fVerbose )
            printf( "  " );
        if ( fVerbose && fVeryVerbose )
            Fra_ClauPrintClause( p->vSatVarsTestCs, p->vCexMain );
        if ( fVerbose )
            printf( " LitsInd = %3d.  ", Vec_IntSize(p->vCexMain) );
        // minimize the inductive property
        Vec_IntClear( p->vCexBase );
        if ( Vec_IntSize(p->vCexMain) > 1 )
//        Fra_ClauMinimizeClause_rec( p, p->vCexBase, p->vCexMain );
            Fra_ClauMinimizeClause( p, p->vCexBase, p->vCexMain );
        assert( Vec_IntSize(p->vCexMain) > 0 );
        if ( fVerbose && fVeryVerbose )
            Fra_ClauPrintClause( p->vSatVarsTestCs, p->vCexMain );
        if ( fVerbose )
            printf( " LitsRed = %3d.  ", Vec_IntSize(p->vCexMain) );
        if ( fVerbose )
            printf( "\n" );
        // add the clause to the solver
        Fra_ClauRemapClause( p->pMapCsTestToCsMain, p->vCexMain, p->vCexAssm, 1 );
        RetValue = sat_solver_addclause( p->pSatMain, Vec_IntArray(p->vCexAssm), Vec_IntArray(p->vCexAssm) + Vec_IntSize(p->vCexAssm) );
        if ( RetValue == 0 )
        {
            Iter++;
            break;
        }
        if ( p->pSatMain->qtail != p->pSatMain->qhead )
        {
            RetValue = sat_solver_simplify(p->pSatMain);
            assert( RetValue != 0 );
            assert( p->pSatMain->qtail == p->pSatMain->qhead );
        }
    }

    // report the results
    if ( Iter == nIters )
    {
        printf( "Property is not proved after %d iterations.\n", nIters );
        return 0;
    }
    printf( "Property is proved after %d iterations.\n", Iter );
    Fra_ClauStop( p );
    return 1;
}